

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlenc.h
# Opt level: O2

size_t vlenc_u64(uint64_t val,uchar *buf)

{
  size_t sVar1;
  
  sVar1 = 1;
  for (; 0x7f < val; val = val >> 7) {
    buf[sVar1 - 1] = (byte)val | 0x80;
    sVar1 = sVar1 + 1;
  }
  buf[sVar1 - 1] = (byte)val;
  return sVar1;
}

Assistant:

inline size_t vlenc_u64(uint64_t val, unsigned char* buf)
{
    size_t nbytes = 0;

    while (val > 0x7F) {
        *buf++ = (val & 0x7F) | 0x80;
        val >>= 7;
        ++nbytes;
    }

    *buf++ = val;
    ++nbytes;

    return nbytes;
}